

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int prolog1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  pcVar2 = error;
  if (tok < 0x10) {
    if (tok - 0xdU < 3) {
      return 0;
    }
    if (tok == 0xb) {
      return 0;
    }
LAB_004e36cd:
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  else {
    if (tok == 0x1d) {
      iVar1 = 2;
      goto LAB_004e36e9;
    }
    if (tok != 0x10) goto LAB_004e36cd;
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"DOCTYPE");
    if (iVar1 != 0) {
      iVar1 = 0;
      pcVar2 = doctype0;
      goto LAB_004e36e9;
    }
  }
  iVar1 = -1;
LAB_004e36e9:
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static
int prolog1(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
  case XML_TOK_COMMENT:
  case XML_TOK_BOM:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (!XmlNameMatchesAscii(enc,
                             ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                             end,
                             KW_DOCTYPE))
      break;
    state->handler = doctype0;
    return XML_ROLE_NONE;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}